

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O1

bool __thiscall mkvmuxer::VideoTrack::Write(VideoTrack *this,IMkvWriter *writer)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint64_t size;
  int extraout_var;
  int extraout_var_00;
  uint64 uVar4;
  
  bVar1 = Track::Write(&this->super_Track,writer);
  if (bVar1) {
    size = VideoPayloadSize(this);
    bVar1 = WriteEbmlMasterElement(writer,0xe0,size);
    if (bVar1) {
      iVar2 = (*writer->_vptr_IMkvWriter[1])(writer);
      if (-1 < extraout_var) {
        uVar4 = this->pixel_width_;
        if (uVar4 == 0) {
          uVar4 = this->width_;
        }
        bVar1 = WriteEbmlElement(writer,0xb0,uVar4);
        if (bVar1) {
          uVar4 = this->pixel_height_;
          if (uVar4 == 0) {
            uVar4 = this->height_;
          }
          bVar1 = WriteEbmlElement(writer,0xba,uVar4);
          if ((((bVar1) &&
               ((this->display_width_ == 0 ||
                (bVar1 = WriteEbmlElement(writer,0x54b0,this->display_width_), bVar1)))) &&
              (((this->display_height_ == 0 ||
                (bVar1 = WriteEbmlElement(writer,0x54ba,this->display_height_), bVar1)) &&
               ((((this->crop_left_ == 0 ||
                  (bVar1 = WriteEbmlElement(writer,0x54cc,this->crop_left_), bVar1)) &&
                 ((this->crop_right_ == 0 ||
                  (bVar1 = WriteEbmlElement(writer,0x54dd,this->crop_right_), bVar1)))) &&
                ((this->crop_top_ == 0 ||
                 (bVar1 = WriteEbmlElement(writer,0x54bb,this->crop_top_), bVar1)))))))) &&
             (((this->crop_bottom_ == 0 ||
               (bVar1 = WriteEbmlElement(writer,0x54aa,this->crop_bottom_), bVar1)) &&
              (((((this->stereo_mode_ == 0 ||
                  (bVar1 = WriteEbmlElement(writer,0x53b8,this->stereo_mode_), bVar1)) &&
                 ((this->alpha_mode_ == 0 ||
                  (bVar1 = WriteEbmlElement(writer,0x53c0,this->alpha_mode_), bVar1)))) &&
                (((this->colour_space_ == (char *)0x0 ||
                  (bVar1 = WriteEbmlElement(writer,0x2eb524,this->colour_space_), bVar1)) &&
                 ((this->frame_rate_ <= 0.0 ||
                  (bVar1 = WriteEbmlElement(writer,0x2383e3,(float)this->frame_rate_), bVar1))))))
               && (((this->colour_ == (Colour *)0x0 ||
                    (bVar1 = Colour::Write(this->colour_,writer), bVar1)) &&
                   ((this->projection_ == (Projection *)0x0 ||
                    (bVar1 = Projection::Write(this->projection_,writer), bVar1)))))))))) {
            iVar3 = (*writer->_vptr_IMkvWriter[1])(writer);
            return CONCAT44(extraout_var_00,iVar3) - CONCAT44(extraout_var,iVar2) == size &&
                   -1 < extraout_var_00;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool VideoTrack::Write(IMkvWriter* writer) const {
  if (!Track::Write(writer))
    return false;

  const uint64_t size = VideoPayloadSize();

  if (!WriteEbmlMasterElement(writer, libwebm::kMkvVideo, size))
    return false;

  const int64_t payload_position = writer->Position();
  if (payload_position < 0)
    return false;

  if (!WriteEbmlElement(
          writer, libwebm::kMkvPixelWidth,
          static_cast<uint64>((pixel_width_ > 0) ? pixel_width_ : width_)))
    return false;
  if (!WriteEbmlElement(
          writer, libwebm::kMkvPixelHeight,
          static_cast<uint64>((pixel_height_ > 0) ? pixel_height_ : height_)))
    return false;
  if (display_width_ > 0) {
    if (!WriteEbmlElement(writer, libwebm::kMkvDisplayWidth,
                          static_cast<uint64>(display_width_)))
      return false;
  }
  if (display_height_ > 0) {
    if (!WriteEbmlElement(writer, libwebm::kMkvDisplayHeight,
                          static_cast<uint64>(display_height_)))
      return false;
  }
  if (crop_left_ > 0) {
    if (!WriteEbmlElement(writer, libwebm::kMkvPixelCropLeft,
                          static_cast<uint64>(crop_left_)))
      return false;
  }
  if (crop_right_ > 0) {
    if (!WriteEbmlElement(writer, libwebm::kMkvPixelCropRight,
                          static_cast<uint64>(crop_right_)))
      return false;
  }
  if (crop_top_ > 0) {
    if (!WriteEbmlElement(writer, libwebm::kMkvPixelCropTop,
                          static_cast<uint64>(crop_top_)))
      return false;
  }
  if (crop_bottom_ > 0) {
    if (!WriteEbmlElement(writer, libwebm::kMkvPixelCropBottom,
                          static_cast<uint64>(crop_bottom_)))
      return false;
  }
  if (stereo_mode_ > kMono) {
    if (!WriteEbmlElement(writer, libwebm::kMkvStereoMode,
                          static_cast<uint64>(stereo_mode_)))
      return false;
  }
  if (alpha_mode_ > kNoAlpha) {
    if (!WriteEbmlElement(writer, libwebm::kMkvAlphaMode,
                          static_cast<uint64>(alpha_mode_)))
      return false;
  }
  if (colour_space_) {
    if (!WriteEbmlElement(writer, libwebm::kMkvColourSpace, colour_space_))
      return false;
  }
  if (frame_rate_ > 0.0) {
    if (!WriteEbmlElement(writer, libwebm::kMkvFrameRate,
                          static_cast<float>(frame_rate_))) {
      return false;
    }
  }
  if (colour_) {
    if (!colour_->Write(writer))
      return false;
  }
  if (projection_) {
    if (!projection_->Write(writer))
      return false;
  }

  const int64_t stop_position = writer->Position();
  if (stop_position < 0 ||
      stop_position - payload_position != static_cast<int64_t>(size)) {
    return false;
  }

  return true;
}